

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StaticAnalyser.cpp
# Opt level: O0

TargetList *
Analyser::Static::PCCompatible::GetTargets
          (TargetList *__return_storage_ptr__,Media *media,string *param_2,IntType param_3)

{
  bool bVar1;
  Target *this;
  unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_> local_48 [3];
  Target *local_30;
  Target *target;
  string *psStack_20;
  IntType param_2_local;
  string *param_1_local;
  Media *media_local;
  TargetList *targets;
  
  target._4_4_ = param_3;
  psStack_20 = param_2;
  param_1_local = (string *)media;
  media_local = (Media *)__return_storage_ptr__;
  bVar1 = std::
          vector<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
          ::empty(&media->disks);
  if (bVar1) {
    memset(__return_storage_ptr__,0,0x18);
    std::
    vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
    ::vector(__return_storage_ptr__);
  }
  else {
    target._3_1_ = 0;
    std::
    vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
    ::vector(__return_storage_ptr__);
    this = (Target *)operator_new(0x90);
    Target::Target(this);
    local_30 = this;
    Media::operator=(&(this->super_Target).media,(Media *)param_1_local);
    std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>::
    unique_ptr<std::default_delete<Analyser::Static::Target>,void>
              ((unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>> *
               )local_48,&local_30->super_Target);
    std::
    vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)local_48);
    std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>::
    ~unique_ptr(local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

Analyser::Static::TargetList Analyser::Static::PCCompatible::GetTargets(const Media &media, const std::string &, TargetPlatform::IntType) {
	// This analyser can comprehend disks only.
	if(media.disks.empty()) return {};

	// No analysis is applied yet.
	Analyser::Static::TargetList targets;

	using Target = Analyser::Static::PCCompatible::Target;
	auto *const target = new Target();
	target->media = media;
	targets.push_back(std::unique_ptr<Analyser::Static::Target>(target));

	return targets;
}